

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetInteger64Verifier::
verifyUnsignedIntegerGreaterOrEqual
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLuint reference)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  long *data;
  ulong *puVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  uint *puVar5;
  uint local_1d4;
  ulong local_1d0 [3];
  MessageBuilder local_1b8;
  undefined1 local_38 [8];
  StateQueryMemoryWriteGuard<long> state;
  GLuint reference_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  state.m_postguard._0_4_ = reference;
  state.m_postguard._4_4_ = name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long> *)local_38);
  pname = state.m_postguard._4_4_;
  data = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::operator&
                   ((StateQueryMemoryWriteGuard<long> *)local_38);
  glu::CallLogWrapper::glGetInteger64v(&(this->super_StateVerifier).super_CallLogWrapper,pname,data)
  ;
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long> *)local_38,testCtx);
  if ((bVar1) &&
     (puVar3 = (ulong *)deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                        operator_cast_to_long_((StateQueryMemoryWriteGuard *)local_38),
     (*puVar3 & 0xffffffff) < (ulong)(GLuint)state.m_postguard)) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [40])"// ERROR: expected greater or equal to ");
    local_1d0[0] = (ulong)(GLuint)state.m_postguard;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(long *)local_1d0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b7cef6);
    puVar5 = (uint *)deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_long_
                               ((StateQueryMemoryWriteGuard *)local_38);
    local_1d4 = *puVar5;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1d4);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyUnsignedIntegerGreaterOrEqual (tcu::TestContext& testCtx, GLenum name, GLuint reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64> state;
	glGetInteger64v(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (GLuint(state) < GLint64(reference))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected greater or equal to " << GLint64(reference) << "; got " << GLuint(state) << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}